

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error bop<24>(context *ctx,token *token,opcode *op)

{
  opcode *in_RCX;
  string_view prefix;
  optional<unsigned_long> oVar1;
  token local_48;
  
  prefix._M_str = ".";
  prefix._M_len = 1;
  oVar1 = find_in_table((token *)op,bop<24>::table,prefix);
  if (((undefined1  [16])
       oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    fail((token *)ctx,(char *)op,"expected .AND, .OR or .XOR");
  }
  else {
    opcode::add_bits(in_RCX,oVar1.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_payload << 0x18);
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(bop)
{
    static const char* table[] = {"AND", "OR", "XOR", "INVALIDBOP3", nullptr};
    const std::optional<int64_t> value = find_in_table(token, table, ".");
    if (!value) {
        return fail(token, "expected .AND, .OR or .XOR");
    }
    op.add_bits(*value << address);
    token = ctx.tokenize();
    return {};
}